

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Backpack.cpp
# Opt level: O3

void __thiscall Backpack::~Backpack(Backpack *this)

{
  pointer ppBVar1;
  pointer ppBVar2;
  
  (this->super_BackpackEntry)._vptr_BackpackEntry = (_func_int **)&PTR__Backpack_00115bb0;
  ppBVar2 = (this->backpack).super__Vector_base<BackpackEntry_*,_std::allocator<BackpackEntry_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppBVar1 = (this->backpack).super__Vector_base<BackpackEntry_*,_std::allocator<BackpackEntry_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppBVar2 != ppBVar1) {
    do {
      if (*ppBVar2 != (BackpackEntry *)0x0) {
        (*(*ppBVar2)->_vptr_BackpackEntry[1])();
      }
      ppBVar2 = ppBVar2 + 1;
    } while (ppBVar2 != ppBVar1);
    ppBVar2 = (this->backpack).super__Vector_base<BackpackEntry_*,_std::allocator<BackpackEntry_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  if (ppBVar2 != (pointer)0x0) {
    operator_delete(ppBVar2,(long)(this->backpack).
                                  super__Vector_base<BackpackEntry_*,_std::allocator<BackpackEntry_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppBVar2
                   );
    return;
  }
  return;
}

Assistant:

Backpack::~Backpack() {
    for (auto i : backpack) {
        delete i;
    }
}